

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O0

bool __thiscall student::operator<(student *this,student *rhs)

{
  int iVar1;
  int iVar2;
  undefined1 local_29;
  int rs;
  int ls;
  student *rhs_local;
  student *this_local;
  
  iVar1 = sum_score(this);
  iVar2 = sum_score(rhs);
  if (iVar1 == iVar2) {
    local_29 = std::operator>(&this->name,&rhs->name);
  }
  else {
    local_29 = iVar1 < iVar2;
  }
  return local_29;
}

Assistant:

bool operator<(const student &rhs) const {
    int ls = sum_score();
    int rs = rhs.sum_score();
    return ls != rs ? ls < rs : name > rhs.name;
  }